

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BVHLoader.cpp
# Opt level: O1

void __thiscall Assimp::BVHLoader::ReadStructure(BVHLoader *this,aiScene *pScene)

{
  int iVar1;
  char *pcVar2;
  string motion;
  string header;
  string local_78;
  string local_58;
  string local_38;
  
  GetNextToken_abi_cxx11_(&local_38,this);
  iVar1 = std::__cxx11::string::compare((char *)&local_38);
  if (iVar1 != 0) {
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,"Expected header string \"HIERARCHY\".","");
    ThrowException(this,&local_78);
  }
  ReadHierarchy(this,pScene);
  GetNextToken_abi_cxx11_(&local_78,this);
  pcVar2 = "MOTION";
  iVar1 = std::__cxx11::string::compare((char *)&local_78);
  if (iVar1 == 0) {
    ReadMotion(this,(aiScene *)pcVar2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"Expected beginning of motion data \"MOTION\".","");
  ThrowException(this,&local_58);
}

Assistant:

void BVHLoader::ReadStructure( aiScene* pScene)
{
    // first comes hierarchy
    std::string header = GetNextToken();
    if( header != "HIERARCHY")
        ThrowException( "Expected header string \"HIERARCHY\".");
    ReadHierarchy( pScene);

    // then comes the motion data
    std::string motion = GetNextToken();
    if( motion != "MOTION")
        ThrowException( "Expected beginning of motion data \"MOTION\".");
    ReadMotion( pScene);
}